

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O0

void mem_done(zng_stream *strm,char *prefix)

{
  uint8_t *puVar1;
  undefined8 in_RSI;
  long in_RDI;
  mem_zone *zone;
  mem_item *next;
  mem_item *item;
  int count;
  char *in_stack_ffffffffffffffc8;
  zng_stream *strm_00;
  uint8_t *local_20;
  uint local_14;
  
  local_14 = 0;
  strm_00 = *(zng_stream **)(in_RDI + 0x50);
  mem_high(strm_00,in_stack_ffffffffffffffc8);
  local_20 = strm_00->next_in;
  while (local_20 != (uint8_t *)0x0) {
    free(*(void **)local_20);
    puVar1 = *(uint8_t **)(local_20 + 0x10);
    free(local_20);
    local_14 = local_14 + 1;
    local_20 = puVar1;
  }
  if ((local_14 != 0) || (*(long *)&strm_00->avail_in != 0)) {
    fprintf(_stderr,"** %s: %lu bytes in %d blocks not freed\n",in_RSI,
            *(undefined8 *)&strm_00->avail_in,(ulong)local_14);
  }
  if (strm_00->avail_out != 0) {
    fprintf(_stderr,"** %s: %d frees not LIFO\n",in_RSI,(ulong)strm_00->avail_out);
  }
  if (*(int *)&strm_00->field_0x24 != 0) {
    fprintf(_stderr,"** %s: %d frees not recognized\n",in_RSI,(ulong)*(uint *)&strm_00->field_0x24);
  }
  free(strm_00);
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

static void mem_done(PREFIX3(stream) *strm, char *prefix) {
    int count = 0;
    struct mem_item *item, *next;
    struct mem_zone *zone = strm->opaque;

    /* show high water mark */
    mem_high(strm, prefix);

    /* free leftover allocations and item structures, if any */
    item = zone->first;
    while (item != NULL) {
        free(item->ptr);
        next = item->next;
        free(item);
        item = next;
        count++;
    }

    /* issue alerts about anything unexpected */
    if (count || zone->total)
        fprintf(stderr, "** %s: %" PRIu64 " bytes in %d blocks not freed\n",
                prefix, (uint64_t)zone->total, count);
    if (zone->notlifo)
        fprintf(stderr, "** %s: %d frees not LIFO\n", prefix, zone->notlifo);
    if (zone->rogue)
        fprintf(stderr, "** %s: %d frees not recognized\n",
                prefix, zone->rogue);

    /* free the zone and delete from the stream */
    free(zone);
    strm->opaque = NULL;
    strm->zalloc = NULL;
    strm->zfree = NULL;
}